

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  uint8 *puVar5;
  void **ppvVar6;
  double *pdVar7;
  bool bVar8;
  Limit limit;
  UninterpretedOption_NamePart *this_00;
  string *psVar9;
  uint32 tag;
  double local_50;
  uint64 *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_40 = &(this->name_).super_RepeatedPtrFieldBase;
  local_48 = &this->positive_int_value_;
  local_38 = &this->_unknown_fields_;
LAB_001f49b2:
  do {
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (tag = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar5 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    switch(tag >> 3) {
    case 2:
      if ((tag & 7) == 2) {
        while( true ) {
          iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
          iVar4 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar3 < iVar4) {
            ppvVar6 = (this->name_).super_RepeatedPtrFieldBase.elements_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            this_00 = (UninterpretedOption_NamePart *)ppvVar6[iVar3];
          }
          else {
            iVar3 = (this->name_).super_RepeatedPtrFieldBase.total_size_;
            if (iVar4 == iVar3) {
              internal::RepeatedPtrFieldBase::Reserve(local_40,iVar3 + 1);
            }
            piVar1 = &(this->name_).super_RepeatedPtrFieldBase.allocated_size_;
            *piVar1 = *piVar1 + 1;
            this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::
                      New();
            ppvVar6 = (this->name_).super_RepeatedPtrFieldBase.elements_;
            iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
            (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            ppvVar6[iVar3] = this_00;
          }
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (-1 < (char)*puVar5)) {
            local_50 = (double)CONCAT44(local_50._4_4_,(int)(char)*puVar5);
            input->buffer_ = puVar5 + 1;
          }
          else {
            bVar8 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_50);
            if (!bVar8) {
              return false;
            }
          }
          iVar3 = input->recursion_depth_;
          input->recursion_depth_ = iVar3 + 1;
          if (input->recursion_limit_ <= iVar3) {
            return false;
          }
          limit = io::CodedInputStream::PushLimit(input,local_50._0_4_);
          bVar8 = UninterpretedOption_NamePart::MergePartialFromCodedStream(this_00,input);
          if (!bVar8) {
            return false;
          }
          if (input->legitimate_message_end_ != true) {
            return false;
          }
          io::CodedInputStream::PopLimit(input,limit);
          if (0 < input->recursion_depth_) {
            input->recursion_depth_ = input->recursion_depth_ + -1;
          }
          puVar5 = input->buffer_;
          if ((input->buffer_end_ <= puVar5) || (*puVar5 != '\x12')) break;
          input->buffer_ = puVar5 + 1;
        }
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x1a')) {
          input->buffer_ = puVar5 + 1;
LAB_001f4b4d:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          if (this->identifier_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar9 = (string *)operator_new(0x20);
            (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
            psVar9->_M_string_length = 0;
            (psVar9->field_2)._M_local_buf[0] = '\0';
            this->identifier_value_ = psVar9;
          }
          bVar8 = internal::WireFormatLite::ReadString(input,this->identifier_value_);
          if (!bVar8) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->identifier_value_->_M_dataplus)._M_p,
                     (int)this->identifier_value_->_M_string_length,PARSE);
          puVar5 = input->buffer_;
          if ((puVar5 < input->buffer_end_) && (*puVar5 == ' ')) {
            input->buffer_ = puVar5 + 1;
LAB_001f4bc3:
            puVar5 = input->buffer_;
            if ((puVar5 < input->buffer_end_) && (-1 < (long)(char)*puVar5)) {
              *local_48 = (long)(char)*puVar5;
              input->buffer_ = puVar5 + 1;
            }
            else {
              bVar8 = io::CodedInputStream::ReadVarint64Fallback(input,local_48);
              if (!bVar8) {
                return false;
              }
            }
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
            puVar5 = input->buffer_;
            if ((puVar5 < input->buffer_end_) && (*puVar5 == '(')) {
              input->buffer_ = puVar5 + 1;
LAB_001f4c64:
              puVar5 = input->buffer_;
              if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
                input->buffer_ = puVar5 + 1;
                local_50 = (double)(long)(char)uVar2;
              }
              else {
                bVar8 = io::CodedInputStream::ReadVarint64Fallback(input,(uint64 *)&local_50);
                if (!bVar8) {
                  return false;
                }
              }
              this->negative_int_value_ = (int64)local_50;
              *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
              puVar5 = input->buffer_;
              if ((puVar5 < input->buffer_end_) && (*puVar5 == '1')) {
                input->buffer_ = puVar5 + 1;
LAB_001f4cc6:
                pdVar7 = (double *)input->buffer_;
                if (*(int *)&input->buffer_end_ - (int)pdVar7 < 8) {
                  bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback
                                    (input,(uint64 *)&local_50);
                  if (!bVar8) {
                    return false;
                  }
                }
                else {
                  local_50 = *pdVar7;
                  input->buffer_ = (uint8 *)(pdVar7 + 1);
                }
                this->double_value_ = local_50;
                *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
                puVar5 = input->buffer_;
                if ((puVar5 < input->buffer_end_) && (*puVar5 == ':')) {
                  input->buffer_ = puVar5 + 1;
LAB_001f4d17:
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
                  if (this->string_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
                    psVar9 = (string *)operator_new(0x20);
                    (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
                    psVar9->_M_string_length = 0;
                    (psVar9->field_2)._M_local_buf[0] = '\0';
                    this->string_value_ = psVar9;
                  }
                  bVar8 = internal::WireFormatLite::ReadBytes(input,this->string_value_);
                  if (!bVar8) {
                    return false;
                  }
                  puVar5 = input->buffer_;
                  if ((puVar5 < input->buffer_end_) && (*puVar5 == 'B')) {
                    input->buffer_ = puVar5 + 1;
LAB_001f4d7c:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    if (this->aggregate_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
                      psVar9 = (string *)operator_new(0x20);
                      (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
                      psVar9->_M_string_length = 0;
                      (psVar9->field_2)._M_local_buf[0] = '\0';
                      this->aggregate_value_ = psVar9;
                    }
                    bVar8 = internal::WireFormatLite::ReadString(input,this->aggregate_value_);
                    if (!bVar8) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->aggregate_value_->_M_dataplus)._M_p,
                               (int)this->aggregate_value_->_M_string_length,PARSE);
                    if ((input->buffer_ == input->buffer_end_) &&
                       ((input->buffer_size_after_limit_ != 0 ||
                        (input->total_bytes_read_ == input->current_limit_)))) {
                      input->last_tag_ = 0;
                      input->legitimate_message_end_ = true;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001f49b2;
      }
      break;
    case 3:
      if ((tag & 7) == 2) goto LAB_001f4b4d;
      break;
    case 4:
      if ((tag & 7) == 0) goto LAB_001f4bc3;
      break;
    case 5:
      if ((tag & 7) == 0) goto LAB_001f4c64;
      break;
    case 6:
      if ((tag & 7) == 1) goto LAB_001f4cc6;
      break;
    case 7:
      if ((tag & 7) == 2) goto LAB_001f4d17;
      break;
    case 8:
      if ((tag & 7) == 2) goto LAB_001f4d7c;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar8 = internal::WireFormat::SkipField(input,tag,local_38);
    if (!bVar8) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_name;
        if (input->ExpectTag(26)) goto parse_identifier_value;
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_identifier_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_positive_int_value;
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_positive_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
          set_has_positive_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_negative_int_value;
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_negative_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
          set_has_negative_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(49)) goto parse_double_value;
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_FIXED64) {
         parse_double_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
          set_has_double_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_string_value;
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_string_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_aggregate_value;
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_aggregate_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}